

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetHB.c
# Opt level: O0

void ResizeCountNodePages(void)

{
  int **ppiVar1;
  int **newNodePages;
  int i;
  
  page = page + 1;
  if (page == maxPages) {
    ppiVar1 = (int **)malloc((long)(maxPages + 0x80) << 3);
    if (ppiVar1 == (int **)0x0) {
      for (newNodePages._4_4_ = 0; newNodePages._4_4_ < page;
          newNodePages._4_4_ = newNodePages._4_4_ + 1) {
        if (nodePages[newNodePages._4_4_] != (int *)0x0) {
          free(nodePages[newNodePages._4_4_]);
          nodePages[newNodePages._4_4_] = (int *)0x0;
        }
      }
      if (nodePages != (int **)0x0) {
        free(nodePages);
        nodePages = (int **)0x0;
      }
      for (newNodePages._4_4_ = 0; newNodePages._4_4_ < page;
          newNodePages._4_4_ = newNodePages._4_4_ + 1) {
        if (lightNodePages[newNodePages._4_4_] != (int *)0x0) {
          free(lightNodePages[newNodePages._4_4_]);
          lightNodePages[newNodePages._4_4_] = (int *)0x0;
        }
      }
      if (lightNodePages != (int **)0x0) {
        free(lightNodePages);
        lightNodePages = (int **)0x0;
      }
      memOut = 1;
      return;
    }
    for (newNodePages._4_4_ = 0; newNodePages._4_4_ < maxPages;
        newNodePages._4_4_ = newNodePages._4_4_ + 1) {
      ppiVar1[newNodePages._4_4_] = nodePages[newNodePages._4_4_];
    }
    if (nodePages != (int **)0x0) {
      free(nodePages);
    }
    nodePages = ppiVar1;
    ppiVar1 = (int **)malloc((long)(maxPages + 0x80) << 3);
    if (ppiVar1 == (int **)0x0) {
      for (newNodePages._4_4_ = 0; newNodePages._4_4_ < page;
          newNodePages._4_4_ = newNodePages._4_4_ + 1) {
        if (nodePages[newNodePages._4_4_] != (int *)0x0) {
          free(nodePages[newNodePages._4_4_]);
          nodePages[newNodePages._4_4_] = (int *)0x0;
        }
      }
      if (nodePages != (int **)0x0) {
        free(nodePages);
        nodePages = (int **)0x0;
      }
      for (newNodePages._4_4_ = 0; newNodePages._4_4_ < page;
          newNodePages._4_4_ = newNodePages._4_4_ + 1) {
        if (lightNodePages[newNodePages._4_4_] != (int *)0x0) {
          free(lightNodePages[newNodePages._4_4_]);
          lightNodePages[newNodePages._4_4_] = (int *)0x0;
        }
      }
      if (lightNodePages != (int **)0x0) {
        free(lightNodePages);
        lightNodePages = (int **)0x0;
      }
      memOut = 1;
      return;
    }
    for (newNodePages._4_4_ = 0; newNodePages._4_4_ < maxPages;
        newNodePages._4_4_ = newNodePages._4_4_ + 1) {
      ppiVar1[newNodePages._4_4_] = lightNodePages[newNodePages._4_4_];
    }
    if (lightNodePages != (int **)0x0) {
      free(lightNodePages);
    }
    maxPages = maxPages + 0x80;
    lightNodePages = ppiVar1;
  }
  currentNodePage = (int *)malloc((long)pageSize << 2);
  nodePages[page] = currentNodePage;
  if (currentNodePage == (int *)0x0) {
    for (newNodePages._4_4_ = 0; newNodePages._4_4_ < page;
        newNodePages._4_4_ = newNodePages._4_4_ + 1) {
      if (nodePages[newNodePages._4_4_] != (int *)0x0) {
        free(nodePages[newNodePages._4_4_]);
        nodePages[newNodePages._4_4_] = (int *)0x0;
      }
    }
    if (nodePages != (int **)0x0) {
      free(nodePages);
      nodePages = (int **)0x0;
    }
    for (newNodePages._4_4_ = 0; newNodePages._4_4_ < page;
        newNodePages._4_4_ = newNodePages._4_4_ + 1) {
      if (lightNodePages[newNodePages._4_4_] != (int *)0x0) {
        free(lightNodePages[newNodePages._4_4_]);
        lightNodePages[newNodePages._4_4_] = (int *)0x0;
      }
    }
    if (lightNodePages != (int **)0x0) {
      free(lightNodePages);
      lightNodePages = (int **)0x0;
    }
    memOut = 1;
  }
  else {
    currentLightNodePage = (int *)malloc((long)pageSize << 2);
    lightNodePages[page] = currentLightNodePage;
    if (currentLightNodePage == (int *)0x0) {
      for (newNodePages._4_4_ = 0; newNodePages._4_4_ <= page;
          newNodePages._4_4_ = newNodePages._4_4_ + 1) {
        if (nodePages[newNodePages._4_4_] != (int *)0x0) {
          free(nodePages[newNodePages._4_4_]);
          nodePages[newNodePages._4_4_] = (int *)0x0;
        }
      }
      if (nodePages != (int **)0x0) {
        free(nodePages);
        nodePages = (int **)0x0;
      }
      for (newNodePages._4_4_ = 0; newNodePages._4_4_ < page;
          newNodePages._4_4_ = newNodePages._4_4_ + 1) {
        if (lightNodePages[newNodePages._4_4_] != (int *)0x0) {
          free(lightNodePages[newNodePages._4_4_]);
          lightNodePages[newNodePages._4_4_] = (int *)0x0;
        }
      }
      if (lightNodePages != (int **)0x0) {
        free(lightNodePages);
        lightNodePages = (int **)0x0;
      }
      memOut = 1;
    }
    else {
      pageIndex = 0;
    }
  }
  return;
}

Assistant:

static void
ResizeCountNodePages(void)
{
    int i;
    int **newNodePages;

    page++;

    /* If the current page index is larger than the number of pages
     * allocated, allocate a new page array. The number of pages is incremented
     * by INITIAL_PAGES.
     */
    if (page == maxPages) {
        newNodePages = ABC_ALLOC(int *,maxPages + INITIAL_PAGES);
        if (newNodePages == NULL) {
            for (i = 0; i < page; i++) ABC_FREE(nodePages[i]);
            ABC_FREE(nodePages);
            for (i = 0; i < page; i++) ABC_FREE(lightNodePages[i]);
            ABC_FREE(lightNodePages);
            memOut = 1;
            return;
        } else {
            for (i = 0; i < maxPages; i++) {
                newNodePages[i] = nodePages[i];
            }
            ABC_FREE(nodePages);
            nodePages = newNodePages;
        }

        newNodePages = ABC_ALLOC(int *,maxPages + INITIAL_PAGES);
        if (newNodePages == NULL) {
            for (i = 0; i < page; i++) ABC_FREE(nodePages[i]);
            ABC_FREE(nodePages);
            for (i = 0; i < page; i++) ABC_FREE(lightNodePages[i]);
            ABC_FREE(lightNodePages);
            memOut = 1;
            return;
        } else {
            for (i = 0; i < maxPages; i++) {
                newNodePages[i] = lightNodePages[i];
            }
            ABC_FREE(lightNodePages);
            lightNodePages = newNodePages;
        }
        /* Increase total page count */
        maxPages += INITIAL_PAGES;
    }
    /* Allocate a new page */
    currentNodePage = nodePages[page] = ABC_ALLOC(int,pageSize);
    if (currentNodePage == NULL) {
        for (i = 0; i < page; i++) ABC_FREE(nodePages[i]);
        ABC_FREE(nodePages);
        for (i = 0; i < page; i++) ABC_FREE(lightNodePages[i]);
        ABC_FREE(lightNodePages);
        memOut = 1;
        return;
    }
    /* Allocate a new page */
    currentLightNodePage = lightNodePages[page] = ABC_ALLOC(int,pageSize);
    if (currentLightNodePage == NULL) {
        for (i = 0; i <= page; i++) ABC_FREE(nodePages[i]);
        ABC_FREE(nodePages);
        for (i = 0; i < page; i++) ABC_FREE(lightNodePages[i]);
        ABC_FREE(lightNodePages);
        memOut = 1;
        return;
    }
    /* reset page index */
    pageIndex = 0;
    return;

}